

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

int __thiscall glu::VarType::getScalarSize(VarType *this)

{
  Type TVar1;
  bool bVar2;
  int iVar3;
  pointer this_00;
  VarType *this_01;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_30;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_28;
  ConstIterator iter;
  int size;
  VarType *this_local;
  
  TVar1 = this->m_type;
  if (TVar1 == TYPE_BASIC) {
    this_local._4_4_ = getDataTypeScalarSize((this->m_data).basic.type);
  }
  else if (TVar1 == TYPE_ARRAY) {
    iVar3 = getScalarSize((this->m_data).array.elementType);
    this_local._4_4_ = iVar3 * (this->m_data).array.size;
  }
  else if (TVar1 == TYPE_STRUCT) {
    iter._M_current._4_4_ = 0;
    local_28._M_current = (StructMember *)StructType::begin((this->m_data).structPtr);
    while( true ) {
      local_30._M_current = (StructMember *)StructType::end((this->m_data).structPtr);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
                ::operator->(&local_28);
      this_01 = StructMember::getType(this_00);
      iVar3 = getScalarSize(this_01);
      iter._M_current._4_4_ = iVar3 + iter._M_current._4_4_;
      __gnu_cxx::
      __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
      ::operator++(&local_28,0);
    }
    this_local._4_4_ = iter._M_current._4_4_;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int VarType::getScalarSize (void) const
{
	switch (m_type)
	{
		case TYPE_BASIC:	return glu::getDataTypeScalarSize(m_data.basic.type);
		case TYPE_ARRAY:	return m_data.array.elementType->getScalarSize()*m_data.array.size;

		case TYPE_STRUCT:
		{
			int size = 0;
			for (StructType::ConstIterator iter = m_data.structPtr->begin(); iter != m_data.structPtr->end(); iter++)
				size += iter->getType().getScalarSize();
			return size;
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}